

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

xmlChar * htmlnamePop(htmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *in_RAX;
  xmlChar *pxVar2;
  
  iVar1 = ctxt->nameNr;
  if (0 < (long)iVar1) {
    ctxt->nameNr = iVar1 - 1U;
    if (iVar1 == 1) {
      pxVar2 = (xmlChar *)0x0;
    }
    else {
      pxVar2 = ctxt->nameTab[(long)iVar1 + -2];
    }
    ctxt->name = pxVar2;
    in_RAX = (xmlChar *)(ulong)(iVar1 - 1U);
    ctxt->nameTab[(long)in_RAX] = (xmlChar *)0x0;
  }
  return in_RAX;
}

Assistant:

static const xmlChar *
htmlnamePop(htmlParserCtxtPtr ctxt)
{
    const xmlChar *ret;

    if (ctxt->nameNr <= 0)
        return (NULL);
    ctxt->nameNr--;
    if (ctxt->nameNr < 0)
        return (NULL);
    if (ctxt->nameNr > 0)
        ctxt->name = ctxt->nameTab[ctxt->nameNr - 1];
    else
        ctxt->name = NULL;
    ret = ctxt->nameTab[ctxt->nameNr];
    ctxt->nameTab[ctxt->nameNr] = NULL;
    return (ret);
}